

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filecache.c
# Opt level: O0

void release_from_cache(h2o_filecache_t *cache,khiter_t iter)

{
  kh_cstr_t pcVar1;
  h2o_filecache_ref_t *ref;
  char *path;
  khiter_t iter_local;
  h2o_filecache_t *cache_local;
  
  pcVar1 = cache->hash->keys[iter];
  kh_del_opencache_set(cache->hash,iter);
  h2o_linklist_unlink((h2o_linklist_t *)(pcVar1 + -0x120));
  h2o_filecache_close_file((h2o_filecache_ref_t *)(pcVar1 + -0x130));
  return;
}

Assistant:

static inline void release_from_cache(h2o_filecache_t *cache, khiter_t iter)
{
    const char *path = kh_key(cache->hash, iter);
    h2o_filecache_ref_t *ref = H2O_STRUCT_FROM_MEMBER(h2o_filecache_ref_t, _path, path);

    /* detach from list */
    kh_del(opencache_set, cache->hash, iter);
    h2o_linklist_unlink(&ref->_lru);

    /* and close */
    h2o_filecache_close_file(ref);
}